

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

trie_node *
trie_lookup_exact(trie_node *root_node,lrtr_ip_addr *prefix,uint8_t mask_len,uint *lvl,_Bool *found)

{
  long lVar1;
  lrtr_ip_addr a;
  lrtr_ip_addr b;
  _Bool _Var2;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff94;
  _Bool *found_local;
  uint *lvl_local;
  uint8_t mask_len_local;
  lrtr_ip_addr *prefix_local;
  trie_node *root_node_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *found = false;
  prefix_local = &root_node->prefix;
  do {
    if (prefix_local == (lrtr_ip_addr *)0x0) {
      root_node_local = (trie_node *)0x0;
LAB_0011df31:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return root_node_local;
    }
    if ((*lvl != 0) && (mask_len < *(byte *)((long)&prefix_local[2].u + 0xc))) {
      *lvl = *lvl - 1;
      root_node_local = *(trie_node **)(prefix_local + 2);
      goto LAB_0011df31;
    }
    if ((*(uint8_t *)((long)&prefix_local[2].u + 0xc) == mask_len) &&
       (a.u.addr6.addr[2] = in_stack_ffffffffffffff7c,
       a._0_12_ = *(undefined1 (*) [12])((long)&prefix_local->u + 4),
       a.u.addr6.addr[3] = (int)*(undefined8 *)prefix, b.u._8_8_ = in_stack_ffffffffffffff94,
       b._0_12_ = *(undefined1 (*) [12])((long)&prefix->u + 4), _Var2 = lrtr_ip_addr_equal(a,b),
       _Var2)) {
      *found = true;
      root_node_local = (trie_node *)prefix_local;
      goto LAB_0011df31;
    }
    _Var2 = is_left_child(prefix,*lvl);
    if (_Var2) {
      if (*(long *)((long)&prefix_local[1].u + 8) == 0) {
        root_node_local = (trie_node *)prefix_local;
        goto LAB_0011df31;
      }
      prefix_local = *(lrtr_ip_addr **)((long)&prefix_local[1].u + 8);
    }
    else {
      if (*(long *)&prefix_local[1].u == 0) {
        root_node_local = (trie_node *)prefix_local;
        goto LAB_0011df31;
      }
      prefix_local = *(lrtr_ip_addr **)&prefix_local[1].u;
    }
    *lvl = *lvl + 1;
  } while( true );
}

Assistant:

struct trie_node *trie_lookup_exact(struct trie_node *root_node, const struct lrtr_ip_addr *prefix,
				    const uint8_t mask_len, unsigned int *lvl, bool *found)
{
	*found = false;

	while (root_node) {
		if (*lvl > 0 && root_node->len > mask_len) {
			(*lvl)--;
			return root_node->parent;
		}

		if (root_node->len == mask_len && lrtr_ip_addr_equal(root_node->prefix, *prefix)) {
			*found = true;
			return root_node;
		}

		if (is_left_child(prefix, *lvl)) {
			if (!root_node->lchild)
				return root_node;
			root_node = root_node->lchild;
		} else {
			if (!root_node->rchild)
				return root_node;
			root_node = root_node->rchild;
		}

		(*lvl)++;
	}
	return NULL;
}